

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Show(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *p;
  int iVar1;
  Aig_Man_t *pMan;
  char *format;
  
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if (iVar1 == -1) {
    p = pAbc->pGia;
    if (p == (Gia_Man_t *)0x0) {
      format = "Abc_CommandAbc9Show(): There is no AIG.\n";
    }
    else {
      if (p->nBufs == 0) {
        pMan = Gia_ManToAigSimple(p);
        Aig_ManShow(pMan,0,(Vec_Ptr_t *)0x0);
        Aig_ManStop(pMan);
        return 0;
      }
      format = "Abc_CommandAbc9Show(): Cannot show GIA with barrier buffers.\n";
    }
    iVar1 = -1;
  }
  else {
    Abc_Print(-2,"usage: &show [-h]\n");
    Abc_Print(-2,"\t        shows the current AIG using GSView\n");
    format = "\t-h    : print the command usage\n";
    iVar1 = -2;
  }
  Abc_Print(iVar1,format);
  return 1;
}

Assistant:

int Abc_CommandAbc9Show( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Aig_Man_t * pMan;
    int c;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Show(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManBufNum(pAbc->pGia) )
    {
        Abc_Print( -1, "Abc_CommandAbc9Show(): Cannot show GIA with barrier buffers.\n" );
        return 1;
    }
    pMan = Gia_ManToAigSimple( pAbc->pGia );
    Aig_ManShow( pMan, 0, NULL );
    Aig_ManStop( pMan );
    return 0;

usage:
    Abc_Print( -2, "usage: &show [-h]\n" );
    Abc_Print( -2, "\t        shows the current AIG using GSView\n" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}